

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_id.cc
# Opt level: O1

string * __thiscall Env::DataTypeStr_abi_cxx11_(string *__return_storage_ptr__,Env *this,ID *id)

{
  IDRecord *pIVar1;
  Exception *this_00;
  Type *pTVar2;
  string local_40;
  
  pTVar2 = (Type *)0x0;
  pIVar1 = lookup(this,id,true,false);
  if (pIVar1 != (IDRecord *)0x0) {
    pTVar2 = pIVar1->data_type;
  }
  if (pTVar2 != (Type *)0x0) {
    (*(pTVar2->super_DataDepElement)._vptr_DataDepElement[0xb])(__return_storage_ptr__,pTVar2);
    return __return_storage_ptr__;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x20);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"data type not defined","");
  Exception::Exception(this_00,&id->super_Object,&local_40);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

string Env::DataTypeStr(const ID* id) const
	{
	Type* type = GetDataType(id);
	if ( ! type )
		throw Exception(id, "data type not defined");
	return type->DataTypeStr();
	}